

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

void __thiscall
ezc3d::DataNS::Points3dNS::Point::Point(Point *this,c3d *c3d,fstream *file,Info *info)

{
  PROCESSOR_TYPE PVar1;
  uint uVar2;
  int iVar3;
  runtime_error *this_00;
  float fVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  
  Vector3d::Vector3d(&this->super_Vector3d);
  (this->super_Vector3d).super_Matrix._vptr_Matrix = (_func_int **)&PTR_print_00148a30;
  this->_residual = -1.0;
  (this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::resize(&this->_cameraMasks,7,false);
  dVar5 = Info::scaleFactor(info);
  if (0.0 <= dVar5) {
    PVar1 = Info::processorType(info);
    iVar3 = ezc3d::c3d::readInt(c3d,PVar1,file,2,0,(seekdir *)&std::ios_base::cur);
    dVar5 = Info::scaleFactor(info);
    (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x1b])(dVar5 * (double)iVar3,this);
    PVar1 = Info::processorType(info);
    iVar3 = ezc3d::c3d::readInt(c3d,PVar1,file,2,0,(seekdir *)&std::ios_base::cur);
    dVar5 = Info::scaleFactor(info);
    (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x1d])(dVar5 * (double)iVar3,this);
    PVar1 = Info::processorType(info);
    iVar3 = ezc3d::c3d::readInt(c3d,PVar1,file,2,0,(seekdir *)&std::ios_base::cur);
    dVar5 = Info::scaleFactor(info);
    (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x1f])(dVar5 * (double)iVar3,this);
    PVar1 = Info::processorType(info);
    if (PVar1 == INTEL) {
      PVar1 = Info::processorType(info);
      uVar2 = ezc3d::c3d::readInt(c3d,PVar1,file,1,0,(seekdir *)&std::ios_base::cur);
      (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x2c])(this,(ulong)uVar2);
      PVar1 = Info::processorType(info);
      iVar3 = ezc3d::c3d::readInt(c3d,PVar1,file,1,0,(seekdir *)&std::ios_base::cur);
      dVar5 = Info::scaleFactor(info);
    }
    else {
      PVar1 = Info::processorType(info);
      if (PVar1 != DEC) {
        PVar1 = Info::processorType(info);
        if (PVar1 == MIPS) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,
                     "MIPS processor type not supported yet, please open a GitHub issue to report that you want this feature!"
                    );
          goto LAB_0012ead0;
        }
        goto LAB_0012ea41;
      }
      PVar1 = Info::processorType(info);
      uVar2 = ezc3d::c3d::readInt(c3d,PVar1,file,1,0,(seekdir *)&std::ios_base::cur);
      (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x2c])(this,(ulong)uVar2);
      PVar1 = Info::processorType(info);
      iVar3 = ezc3d::c3d::readInt(c3d,PVar1,file,1,0,(seekdir *)&std::ios_base::cur);
      dVar5 = Info::scaleFactor(info);
    }
  }
  else {
    PVar1 = Info::processorType(info);
    fVar4 = ezc3d::c3d::readFloat(c3d,PVar1,file,0,(seekdir *)&std::ios_base::cur);
    (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x1b])((double)fVar4,this);
    PVar1 = Info::processorType(info);
    fVar4 = ezc3d::c3d::readFloat(c3d,PVar1,file,0,(seekdir *)&std::ios_base::cur);
    (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x1d])((double)fVar4,this);
    PVar1 = Info::processorType(info);
    fVar4 = ezc3d::c3d::readFloat(c3d,PVar1,file,0,(seekdir *)&std::ios_base::cur);
    (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x1f])((double)fVar4,this);
    PVar1 = Info::processorType(info);
    if (PVar1 != INTEL) {
      PVar1 = Info::processorType(info);
      if (PVar1 == DEC) {
        PVar1 = Info::processorType(info);
        iVar3 = ezc3d::c3d::readInt(c3d,PVar1,file,2,0,(seekdir *)&std::ios_base::cur);
        dVar5 = Info::scaleFactor(info);
        (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x29])(-dVar5 * (double)iVar3,this);
        PVar1 = Info::processorType(info);
        uVar2 = ezc3d::c3d::readInt(c3d,PVar1,file,2,0,(seekdir *)&std::ios_base::cur);
        (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x2c])(this,(ulong)uVar2);
      }
      else {
        PVar1 = Info::processorType(info);
        if (PVar1 == MIPS) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,
                     "MIPS processor type not supported yet, please open a GitHub issue to report that you want this feature!"
                    );
LAB_0012ead0:
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      goto LAB_0012ea41;
    }
    PVar1 = Info::processorType(info);
    uVar2 = ezc3d::c3d::readInt(c3d,PVar1,file,2,0,(seekdir *)&std::ios_base::cur);
    (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x2c])(this,(ulong)uVar2);
    PVar1 = Info::processorType(info);
    iVar3 = ezc3d::c3d::readInt(c3d,PVar1,file,2,0,(seekdir *)&std::ios_base::cur);
    dVar5 = Info::scaleFactor(info);
    dVar5 = -dVar5;
  }
  (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x29])(dVar5 * (double)iVar3,this);
LAB_0012ea41:
  (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x28])(this);
  if (extraout_XMM0_Qa < 0.0) {
    (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x19])
              (0x7ff8000000000000,0x7ff8000000000000,0,this);
  }
  return;
}

Assistant:

ezc3d::DataNS::Points3dNS::Point::Point(
    ezc3d::c3d &c3d, std::fstream &file,
    const ezc3d::DataNS::Points3dNS::Info &info)
    : ezc3d::Vector3d(), _residual(-1) {
  _cameraMasks.resize(7, false);
  if (info.scaleFactor() < 0) { // if it is float
    x(c3d.readFloat(info.processorType(), file));
    y(c3d.readFloat(info.processorType(), file));
    z(c3d.readFloat(info.processorType(), file));
    if (info.processorType() == PROCESSOR_TYPE::INTEL) {
      cameraMask(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::WORD));
      residual(static_cast<float>(c3d.readInt(info.processorType(), file,
                                              ezc3d::DATA_TYPE::WORD)) *
               -info.scaleFactor());
    } else if (info.processorType() == PROCESSOR_TYPE::DEC) {
      residual(static_cast<float>(c3d.readInt(info.processorType(), file,
                                              ezc3d::DATA_TYPE::WORD)) *
               -info.scaleFactor());
      cameraMask(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::WORD));
    } else if (info.processorType() == PROCESSOR_TYPE::MIPS) {
      throw std::runtime_error(
          "MIPS processor type not supported yet, please open a "
          "GitHub issue to report that you want this feature!");
    }
  } else {
    x(static_cast<float>(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::WORD)) *
      info.scaleFactor());
    y(static_cast<float>(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::WORD)) *
      info.scaleFactor());
    z(static_cast<float>(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::WORD)) *
      info.scaleFactor());
    if (info.processorType() == PROCESSOR_TYPE::INTEL) {
      cameraMask(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::BYTE));
      residual(static_cast<float>(c3d.readInt(info.processorType(), file,
                                              ezc3d::DATA_TYPE::BYTE)) *
               info.scaleFactor());
    } else if (info.processorType() == PROCESSOR_TYPE::DEC) {
      cameraMask(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::BYTE));
      residual(static_cast<float>(c3d.readInt(info.processorType(), file,
                                              ezc3d::DATA_TYPE::BYTE)) *
               info.scaleFactor());
    } else if (info.processorType() == PROCESSOR_TYPE::MIPS) {
      throw std::runtime_error(
          "MIPS processor type not supported yet, please open a "
          "GitHub issue to report that you want this feature!");
    }
  }
  if (residual() < 0) {
    set(NAN, NAN, NAN);
  }
}